

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void print_conditions(NODE *n)

{
  NODE *local_10;
  NODE *n_local;
  
  for (local_10 = n; local_10 != (NODE *)0x0; local_10 = (local_10->u).CREATETABLE.attrlist) {
    print_condition((local_10->u).QUERY.relattrlist);
    if ((local_10->u).CREATETABLE.attrlist != (node *)0x0) {
      printf(" and");
    }
  }
  return;
}

Assistant:

static void print_conditions(NODE *n)
{
   for(; n != NULL; n = n -> u.LIST.next){
      print_condition(n->u.LIST.curr);
      if(n -> u.LIST.next != NULL)
         printf(" and");
   }
}